

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMDocumentImpl::createNodeIterator(DOMDocumentImpl *this)

{
  DOMNodeFilter *in_RCX;
  ShowType in_RDX;
  DOMNode *in_RSI;
  bool in_R8B;
  
  createNodeIterator((DOMDocumentImpl *)&this[-1].fMemoryManager,in_RSI,in_RDX,in_RCX,in_R8B);
  return;
}

Assistant:

DOMNodeIterator* DOMDocumentImpl::createNodeIterator (
  DOMNode *root,
  DOMNodeFilter::ShowType whatToShow,
  DOMNodeFilter* filter,
  bool entityReferenceExpansion)
{
    if (!root) {
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, getMemoryManager());
        return 0;
    }

    DOMNodeIteratorImpl* nodeIterator = new (this) DOMNodeIteratorImpl(this, root, whatToShow, filter, entityReferenceExpansion);

    if (fNodeIterators == 0L) {
        //fNodeIterators = new (this) NodeIterators(1, false);
        fNodeIterators = new (fMemoryManager) NodeIterators(1, false, fMemoryManager);
    }
    fNodeIterators->addElement(nodeIterator);

    return nodeIterator;
}